

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_ghost_long(REF_CELL ref_cell,REF_NODE ref_node,REF_LONG *data)

{
  int iVar1;
  int iVar2;
  REF_MPI pRVar3;
  uint uVar4;
  uint uVar5;
  REF_STATUS RVar6;
  REF_INT *send_size;
  ulong uVar7;
  REF_INT *recv_size;
  void *pvVar8;
  undefined4 *puVar9;
  undefined8 uVar10;
  undefined4 *puVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  int local_114;
  undefined4 *local_110;
  void *local_108;
  REF_MPI local_100;
  REF_NODE local_f8;
  int local_ec;
  void *local_e8;
  void *local_e0;
  void *local_d8;
  void *local_d0;
  REF_INT local;
  REF_LONG *local_c0;
  ulong local_b8;
  ulong local_b0;
  REF_INT nodes [27];
  
  pRVar3 = ref_node->ref_mpi;
  uVar14 = (ulong)pRVar3->n;
  if ((long)uVar14 < 2) {
    return 0;
  }
  local_f8 = ref_node;
  send_size = (REF_INT *)malloc(uVar14 * 4);
  if (send_size == (REF_INT *)0x0) {
    pcVar12 = "malloc a_size of REF_INT NULL";
    uVar10 = 0x572;
  }
  else {
    for (uVar7 = 0; uVar7 < uVar14; uVar7 = uVar7 + 1) {
      send_size[uVar7] = 0;
    }
    local_100 = pRVar3;
    recv_size = (REF_INT *)malloc(uVar14 * 4);
    if (recv_size == (REF_INT *)0x0) {
      pcVar12 = "malloc b_size of REF_INT NULL";
      uVar10 = 0x573;
    }
    else {
      for (uVar7 = 0; uVar7 < uVar14; uVar7 = uVar7 + 1) {
        recv_size[uVar7] = 0;
      }
      local_c0 = data;
      for (iVar15 = 0; pRVar3 = local_100, iVar15 < ref_cell->max; iVar15 = iVar15 + 1) {
        if (ref_cell->c2n[(long)iVar15 * (long)ref_cell->size_per] != -1) {
          uVar4 = ref_cell_part(ref_cell,local_f8,iVar15,&local_114);
          if (uVar4 != 0) {
            uVar14 = (ulong)uVar4;
            pcVar12 = "cell part";
            uVar10 = 0x576;
            goto LAB_00110f0f;
          }
          if (local_114 != local_100->id) {
            send_size[local_114] = send_size[local_114] + 1;
          }
        }
      }
      uVar4 = ref_mpi_alltoall(local_100,send_size,recv_size,1);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x57b,"ref_cell_ghost_long",(ulong)uVar4,"alltoall sizes");
        return uVar4;
      }
      uVar4 = pRVar3->n;
      uVar14 = 0;
      uVar7 = 0;
      if (0 < (int)uVar4) {
        uVar7 = (ulong)uVar4;
      }
      uVar16 = 0;
      for (; uVar7 != uVar14; uVar14 = uVar14 + 1) {
        uVar16 = uVar16 + send_size[uVar14];
      }
      uVar5 = ref_cell->node_per * uVar16;
      if ((int)uVar5 < 0) {
        pcVar12 = "malloc a_nodes of REF_GLOB negative";
        uVar10 = 0x57f;
LAB_00111030:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               uVar10,"ref_cell_ghost_long",pcVar12);
        return 1;
      }
      local_108 = (void *)CONCAT44(local_108._4_4_,ref_cell->node_per);
      local_110 = (undefined4 *)(ulong)uVar4;
      pvVar8 = malloc((ulong)uVar5 << 3);
      if (pvVar8 == (void *)0x0) {
        pcVar12 = "malloc a_nodes of REF_GLOB NULL";
        uVar10 = 0x57f;
      }
      else {
        if ((int)uVar16 < 0) {
          pcVar12 = "malloc a_data of REF_LONG negative";
          uVar10 = 0x580;
          goto LAB_00111030;
        }
        uVar14 = (ulong)uVar16;
        local_d0 = pvVar8;
        pvVar8 = malloc(uVar14 * 8);
        if (pvVar8 == (void *)0x0) {
          pcVar12 = "malloc a_data of REF_LONG NULL";
          uVar10 = 0x580;
        }
        else {
          local_d8 = pvVar8;
          local_b0 = uVar14;
          pvVar8 = malloc(uVar14 * 4);
          if (pvVar8 == (void *)0x0) {
            pcVar12 = "malloc a_cell of REF_INT NULL";
            uVar10 = 0x581;
          }
          else {
            uVar4 = 0;
            for (uVar14 = 0; uVar7 != uVar14; uVar14 = uVar14 + 1) {
              uVar4 = uVar4 + recv_size[uVar14];
            }
            uVar16 = (int)local_108 * uVar4;
            if ((int)uVar16 < 0) {
              pcVar12 = "malloc b_nodes of REF_GLOB negative";
              uVar10 = 0x585;
              goto LAB_00111030;
            }
            local_108 = pvVar8;
            pvVar8 = malloc((ulong)uVar16 << 3);
            if (pvVar8 == (void *)0x0) {
              pcVar12 = "malloc b_nodes of REF_GLOB NULL";
              uVar10 = 0x585;
            }
            else {
              if ((int)uVar4 < 0) {
                pcVar12 = "malloc b_data of REF_LONG negative";
                uVar10 = 0x586;
                goto LAB_00111030;
              }
              local_b8 = (ulong)uVar4;
              local_e0 = pvVar8;
              pvVar8 = malloc(local_b8 * 8);
              if (pvVar8 == (void *)0x0) {
                pcVar12 = "malloc b_data of REF_LONG NULL";
                uVar10 = 0x586;
              }
              else {
                if ((int)local_110 < 0) {
                  pcVar12 = "malloc a_next of REF_INT negative";
                  uVar10 = 0x588;
                  goto LAB_00111030;
                }
                puVar9 = (undefined4 *)malloc((long)local_110 * 4);
                if (puVar9 != (undefined4 *)0x0) {
                  *puVar9 = 0;
                  iVar15 = 0;
                  for (puVar11 = (undefined4 *)0x1; puVar11 < local_110;
                      puVar11 = (undefined4 *)((long)puVar11 + 1)) {
                    iVar15 = iVar15 + send_size[(long)puVar11 + -1];
                    puVar9[(long)puVar11] = iVar15;
                  }
                  local_114 = (int)puVar11;
                  lVar17 = -1;
                  local_110 = puVar9;
                  local_e8 = pvVar8;
                  for (iVar15 = 0; iVar15 < ref_cell->max; iVar15 = iVar15 + 1) {
                    RVar6 = ref_cell_nodes(ref_cell,iVar15,nodes);
                    if (RVar6 == 0) {
                      uVar4 = ref_cell_part(ref_cell,local_f8,iVar15,&local_114);
                      if (uVar4 != 0) {
                        uVar14 = (ulong)uVar4;
                        pcVar12 = "cell part";
                        uVar10 = 0x58e;
                        goto LAB_00110f0f;
                      }
                      if (local_114 != local_100->id) {
                        iVar1 = local_110[local_114];
                        *(int *)((long)local_108 + (long)iVar1 * 4) = iVar15;
                        uVar4 = ref_cell->node_per;
                        uVar14 = (ulong)uVar4;
                        if ((int)uVar4 < 1) {
                          uVar14 = 0;
                        }
                        for (uVar7 = 0; uVar14 != uVar7; uVar7 = uVar7 + 1) {
                          iVar2 = nodes[uVar7];
                          lVar13 = lVar17;
                          if (((-1 < (long)iVar2) && (iVar2 < local_f8->max)) &&
                             (lVar13 = local_f8->global[iVar2], local_f8->global[iVar2] < 0)) {
                            lVar13 = lVar17;
                          }
                          *(long *)((long)local_d0 + uVar7 * 8 + (long)(int)(uVar4 * iVar1) * 8) =
                               lVar13;
                        }
                        local_110[local_114] = iVar1 + 1;
                      }
                    }
                  }
                  local_ec = iVar15;
                  uVar4 = ref_mpi_alltoallv(local_100,local_d0,send_size,local_e0,recv_size,
                                            ref_cell->node_per,2);
                  if (uVar4 == 0) {
                    for (uVar14 = 0; uVar14 != local_b8; uVar14 = uVar14 + 1) {
                      for (lVar17 = 0; lVar17 < ref_cell->node_per; lVar17 = lVar17 + 1) {
                        uVar4 = ref_node_local(local_f8,*(REF_GLOB *)
                                                         ((long)local_e0 +
                                                         (long)(ref_cell->node_per * (int)uVar14 +
                                                               (int)lVar17) * 8),&local);
                        if (uVar4 != 0) {
                          uVar14 = (ulong)uVar4;
                          pcVar12 = "local";
                          uVar10 = 0x5a1;
                          goto LAB_00110f0f;
                        }
                        nodes[lVar17] = local;
                      }
                      uVar4 = ref_cell_with(ref_cell,nodes,&local_ec);
                      if (uVar4 != 0) {
                        uVar14 = (ulong)uVar4;
                        pcVar12 = "find cell";
                        uVar10 = 0x5a4;
                        goto LAB_00110f0f;
                      }
                      *(REF_LONG *)((long)local_e8 + uVar14 * 8) = local_c0[local_ec];
                    }
                    uVar4 = ref_mpi_alltoallv(local_100,local_e8,recv_size,local_d8,send_size,1,2);
                    if (uVar4 == 0) {
                      for (uVar14 = 0; local_b0 != uVar14; uVar14 = uVar14 + 1) {
                        local_c0[*(int *)((long)local_108 + uVar14 * 4)] =
                             *(REF_LONG *)((long)local_d8 + uVar14 * 8);
                      }
                      free(local_110);
                      free(local_e8);
                      free(local_e0);
                      free(local_108);
                      free(local_d8);
                      free(local_d0);
                      free(recv_size);
                      free(send_size);
                      return 0;
                    }
                    uVar14 = (ulong)uVar4;
                    pcVar12 = "alltoallv return data";
                    uVar10 = 0x5aa;
                  }
                  else {
                    uVar14 = (ulong)uVar4;
                    pcVar12 = "alltoallv requested nodes";
                    uVar10 = 0x59c;
                  }
LAB_00110f0f:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                         ,uVar10,"ref_cell_ghost_long",uVar14,pcVar12);
                  return (REF_STATUS)uVar14;
                }
                pcVar12 = "malloc a_next of REF_INT NULL";
                uVar10 = 0x588;
              }
            }
          }
        }
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar10,
         "ref_cell_ghost_long",pcVar12);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_cell_ghost_long(REF_CELL ref_cell, REF_NODE ref_node,
                                       REF_LONG *data) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT cell;
  REF_INT part;
  REF_INT *a_next, *a_cell;
  REF_GLOB *a_nodes, *b_nodes;
  REF_LONG *a_data, *b_data;

  REF_INT cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB global;
  REF_INT local;
  REF_INT request;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "cell part");
    if (part != ref_mpi_rank(ref_mpi)) a_size[part]++;
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_nodes, ref_cell_node_per(ref_cell) * a_total, REF_GLOB);
  ref_malloc(a_data, a_total, REF_LONG);
  ref_malloc(a_cell, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_nodes, ref_cell_node_per(ref_cell) * b_total, REF_GLOB);
  ref_malloc(b_data, b_total, REF_LONG);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "cell part");
    if (part != ref_mpi_rank(ref_mpi)) {
      a_cell[a_next[part]] = cell;
      for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell);
           cell_node++) {
        a_nodes[cell_node + ref_cell_node_per(ref_cell) * a_next[part]] =
            ref_node_global(ref_node, nodes[cell_node]);
      }
      (a_next[part])++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_nodes, a_size, b_nodes, b_size,
                        ref_cell_node_per(ref_cell), REF_GLOB_TYPE),
      "alltoallv requested nodes");

  for (request = 0; request < b_total; request++) {
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      global = b_nodes[cell_node + ref_cell_node_per(ref_cell) * request];
      RSS(ref_node_local(ref_node, global, &(local)), "local");
      nodes[cell_node] = local;
    }
    RSS(ref_cell_with(ref_cell, nodes, &cell), "find cell");
    b_data[request] = data[cell];
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_data, b_size, a_data, a_size, 1,
                        REF_LONG_TYPE),
      "alltoallv return data");

  for (request = 0; request < a_total; request++) {
    data[a_cell[request]] = a_data[request];
  }

  ref_free(a_next);

  ref_free(b_data);
  ref_free(b_nodes);

  ref_free(a_cell);

  ref_free(a_data);
  ref_free(a_nodes);

  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}